

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O2

t_float fielddesc_getcoord(_fielddesc *f,t_template *template,t_word *wp,int loud)

{
  t_float tVar1;
  
  if (f->fd_type == '\x01') {
    if (f->fd_var != '\0') {
      tVar1 = template_getfloat(template,(f->fd_un).fd_symbol,wp,loud);
      tVar1 = fielddesc_cvttocoord(f,tVar1);
      return tVar1;
    }
    tVar1 = (f->fd_un).fd_float;
  }
  else {
    tVar1 = 0.0;
    if (loud != 0) {
      pd_error((void *)0x0,"symbolic data field used as number");
      tVar1 = 0.0;
    }
  }
  return tVar1;
}

Assistant:

t_float fielddesc_getcoord(t_fielddesc *f, t_template *template,
    t_word *wp, int loud)
{
    if (f->fd_type == A_FLOAT)
    {
        if (f->fd_var)
        {
            t_float val = template_getfloat(template,
                f->fd_un.fd_varsym, wp, loud);
            return (fielddesc_cvttocoord(f, val));
        }
        else return (f->fd_un.fd_float);
    }
    else
    {
        if (loud)
            pd_error(0, "symbolic data field used as number");
        return (0);
    }
}